

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Apu.cpp
# Opt level: O0

void __thiscall Ay_Apu::run_until(Ay_Apu *this,blip_time_t final_end_time)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Blip_Buffer *this_00;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  int in_ESI;
  long in_RDI;
  bool bVar10;
  blargg_long count_2;
  blip_time_t remain;
  blargg_long count_1;
  blargg_long remain_1;
  int changed;
  blip_time_t end;
  int phase;
  int delta_non_zero;
  int delta_1;
  int delta;
  int amp;
  blargg_ulong noise_lfsr;
  blip_time_t ntime;
  blargg_long count;
  blip_time_t time;
  blip_time_t period;
  int osc_env_pos;
  int volume;
  int vol_mode;
  blip_time_t end_time;
  blip_time_t start_time;
  blip_time_t inaudible_period;
  int half_vol;
  Blip_Buffer *osc_output;
  int osc_mode;
  osc_t *osc;
  int index;
  blip_time_t env_period;
  blip_time_t env_period_factor;
  blargg_ulong old_noise_lfsr;
  blip_time_t old_noise_delay;
  blip_time_t noise_period;
  blip_time_t noise_period_factor;
  int in_stack_ffffffffffffff48;
  blip_time_t in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  int local_98;
  int local_88;
  uint local_84;
  int local_7c;
  int local_74;
  uint local_70;
  int local_6c;
  int local_64;
  int local_5c;
  int local_58;
  int local_50;
  sbyte local_44;
  uint local_34;
  int local_28;
  int local_24;
  int local_14;
  
  local_14 = (*(byte *)(in_RDI + 0x52) & 0x1f) << 5;
  if ((*(byte *)(in_RDI + 0x52) & 0x1f) == 0) {
    local_14 = 0x20;
  }
  iVar8 = *(int *)(in_RDI + 0x5c);
  uVar2 = *(uint *)(in_RDI + 0x60);
  local_24 = (uint)*(ushort *)(in_RDI + 0x57) << 5;
  if (*(ushort *)(in_RDI + 0x57) == 0) {
    local_24 = 0x20;
  }
  if (*(int *)(in_RDI + 0x68) == 0) {
    *(int *)(in_RDI + 0x68) = local_24;
  }
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    piVar9 = (int *)(in_RDI + (long)local_28 * 0x18);
    local_34 = (int)(uint)*(byte *)(in_RDI + 0x53) >> ((byte)local_28 & 0x1f);
    this_00 = *(Blip_Buffer **)(piVar9 + 4);
    if (this_00 != (Blip_Buffer *)0x0) {
      Blip_Buffer::set_modified(this_00);
      local_44 = 0;
      lVar7 = Blip_Buffer::clock_rate(this_00);
      if ((*piVar9 <= (int)((int)lVar7 + 0x4000U >> 0xf)) && ((local_34 & 1) == 0)) {
        local_44 = 1;
        local_34 = local_34 | 1;
      }
      iVar3 = *(int *)(in_RDI + 0x48);
      bVar1 = *(byte *)(in_RDI + 0x4c + (long)(local_28 + 8));
      local_58 = (int)(uint)""[(int)(bVar1 & 0xf)] >> local_44;
      local_5c = *(int *)(in_RDI + 0x78);
      local_50 = in_ESI;
      if ((bVar1 & 0x10) == 0) {
        if (local_58 == 0) {
          local_34 = 9;
        }
      }
      else {
        local_58 = (int)(uint)*(byte *)(*(long *)(in_RDI + 0x70) + (long)local_5c) >> local_44;
        if (((*(byte *)(in_RDI + 0x59) & 1) == 0) || (local_5c < -0x20)) {
          local_50 = iVar3 + *(int *)(in_RDI + 0x68);
          if (in_ESI <= local_50) {
            local_50 = in_ESI;
          }
        }
        else if (local_58 == 0) {
          local_34 = 9;
        }
      }
      iVar4 = *piVar9;
      local_64 = iVar3 + piVar9[1];
      if ((local_34 & 1) != 0) {
        iVar5 = ((in_ESI - local_64) + iVar4 + -1) / iVar4;
        local_64 = iVar5 * iVar4 + local_64;
        *(ushort *)((long)piVar9 + 10) = *(ushort *)((long)piVar9 + 10) ^ (ushort)iVar5 & 1;
      }
      local_70 = 1;
      local_6c = in_ESI;
      if ((local_34 & 8) == 0) {
        local_6c = iVar3 + iVar8;
        local_70 = uVar2;
      }
      while( true ) {
        local_74 = 0;
        if (((local_34 | (int)*(short *)((long)piVar9 + 10)) & 1 & ((int)local_34 >> 3 | local_70))
            != 0) {
          local_74 = local_58;
        }
        if (local_74 != (short)piVar9[2]) {
          *(short *)(piVar9 + 2) = (short)local_74;
          Blip_Synth<12,_1>::offset
                    ((Blip_Synth<12,_1> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,(Blip_Buffer *)0x96d650);
        }
        if ((local_6c < local_50) || (local_64 < local_50)) {
          local_7c = local_74 * 2 - local_58;
          bVar10 = local_7c != 0;
          local_84 = (int)*(short *)((long)piVar9 + 10) | local_34 & 1;
          do {
            local_88 = local_50;
            if (local_64 < local_50) {
              local_88 = local_64;
            }
            if ((local_84 & bVar10) == 0) {
              if (-1 < local_88 - local_6c) {
                local_6c = local_14 + ((local_88 - local_6c) / local_14) * local_14 + local_6c;
              }
            }
            else {
              for (; local_6c <= local_88; local_6c = local_14 + local_6c) {
                uVar6 = local_70 + 1;
                local_70 = -(local_70 & 1) & 0x12000 ^ local_70 >> 1;
                if ((uVar6 & 2) != 0) {
                  local_7c = -local_7c;
                  Blip_Synth<12,_1>::offset
                            ((Blip_Synth<12,_1> *)
                             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                             (Blip_Buffer *)0x96d731);
                }
              }
            }
            local_88 = local_50;
            if (local_6c < local_50) {
              local_88 = local_6c;
            }
            if ((local_70 & bVar10) == 0) {
              for (; local_64 < local_88; local_64 = iVar4 + local_64) {
                local_84 = local_84 ^ 1;
              }
            }
            else {
              for (; local_64 < local_88; local_64 = iVar4 + local_64) {
                local_7c = -local_7c;
                Blip_Synth<12,_1>::offset
                          ((Blip_Synth<12,_1> *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                           (Blip_Buffer *)0x96d7e1);
              }
              local_84 = (uint)-local_7c >> 0x1f;
            }
            in_stack_ffffffffffffff57 = local_64 < local_50 || local_6c < local_50;
          } while ((bool)in_stack_ffffffffffffff57);
          *(short *)(piVar9 + 2) = (short)(local_7c + local_58 >> 1);
          if ((local_34 & 1) == 0) {
            *(short *)((long)piVar9 + 10) = (short)local_84;
          }
        }
        if (in_ESI <= local_50) break;
        iVar3 = local_5c + 1;
        if (-1 < local_5c + 1) {
          iVar3 = local_5c + -0x1f;
        }
        local_5c = iVar3;
        local_58 = (int)(uint)*(byte *)(*(long *)(in_RDI + 0x70) + (long)local_5c) >> local_44;
        local_50 = local_24 + local_50;
        if (in_ESI < local_50) {
          local_50 = in_ESI;
        }
      }
      piVar9[1] = local_64 - in_ESI;
      if ((local_34 & 8) == 0) {
        *(int *)(in_RDI + 0x5c) = local_6c - in_ESI;
        *(uint *)(in_RDI + 0x60) = local_70;
      }
    }
  }
  local_98 = (in_ESI - *(int *)(in_RDI + 0x48)) - *(int *)(in_RDI + 0x68);
  if (-1 < local_98) {
    iVar8 = (local_98 + local_24) / local_24;
    *(int *)(in_RDI + 0x78) = iVar8 + *(int *)(in_RDI + 0x78);
    if (-1 < *(int *)(in_RDI + 0x78)) {
      *(uint *)(in_RDI + 0x78) = (*(uint *)(in_RDI + 0x78) & 0x1f) - 0x20;
    }
    local_98 = local_98 - iVar8 * local_24;
  }
  *(int *)(in_RDI + 0x68) = -local_98;
  *(int *)(in_RDI + 0x48) = in_ESI;
  return;
}

Assistant:

void Ay_Apu::run_until( blip_time_t final_end_time )
{
	require( final_end_time >= last_time );
	
	// noise period and initial values
	blip_time_t const noise_period_factor = period_factor * 2; // verified
	blip_time_t noise_period = (regs [6] & 0x1F) * noise_period_factor;
	if ( !noise_period )
		noise_period = noise_period_factor;
	blip_time_t const old_noise_delay = noise.delay;
	blargg_ulong const old_noise_lfsr = noise.lfsr;
	
	// envelope period
	blip_time_t const env_period_factor = period_factor * 2; // verified
	blip_time_t env_period = (regs [12] * 0x100L + regs [11]) * env_period_factor;
	if ( !env_period )
		env_period = env_period_factor; // same as period 1 on my AY chip
	if ( !env.delay )
		env.delay = env_period;
	
	// run each osc separately
	for ( int index = 0; index < osc_count; index++ )
	{
		osc_t* const osc = &oscs [index];
		int osc_mode = regs [7] >> index;
		
		// output
		Blip_Buffer* const osc_output = osc->output;
		if ( !osc_output )
			continue;
		osc_output->set_modified();
		
		// period
		int half_vol = 0;
		blip_time_t inaudible_period = (blargg_ulong) (osc_output->clock_rate() +
				inaudible_freq) / (inaudible_freq * 2);
		if ( osc->period <= inaudible_period && !(osc_mode & tone_off) )
		{
			half_vol = 1; // Actually around 60%, but 50% is close enough
			osc_mode |= tone_off;
		}
		
		// envelope
		blip_time_t start_time = last_time;
		blip_time_t end_time   = final_end_time;
		int const vol_mode = regs [0x08 + index];
		int volume = amp_table [vol_mode & 0x0F] >> half_vol;
		int osc_env_pos = env.pos;
		if ( vol_mode & 0x10 )
		{
			volume = env.wave [osc_env_pos] >> half_vol;
			// use envelope only if it's a repeating wave or a ramp that hasn't finished
			if ( !(regs [13] & 1) || osc_env_pos < -32 )
			{
				end_time = start_time + env.delay;
				if ( end_time >= final_end_time )
					end_time = final_end_time;
				
				//if ( !(regs [12] | regs [11]) )
				//  debug_printf( "Used envelope period 0\n" );
			}
			else if ( !volume )
			{
				osc_mode = noise_off | tone_off;
			}
		}
		else if ( !volume )
		{
			osc_mode = noise_off | tone_off;
		}
		
		// tone time
		blip_time_t const period = osc->period;
		blip_time_t time = start_time + osc->delay;
		if ( osc_mode & tone_off ) // maintain tone's phase when off
		{
			blargg_long count = (final_end_time - time + period - 1) / period;
			time += count * period;
			osc->phase ^= count & 1;
		}
		
		// noise time
		blip_time_t ntime = final_end_time;
		blargg_ulong noise_lfsr = 1;
		if ( !(osc_mode & noise_off) )
		{
			ntime = start_time + old_noise_delay;
			noise_lfsr = old_noise_lfsr;
			//if ( (regs [6] & 0x1F) == 0 )
			//  debug_printf( "Used noise period 0\n" );
		}
		
		// The following efficiently handles several cases (least demanding first):
		// * Tone, noise, and envelope disabled, where channel acts as 4-bit DAC
		// * Just tone or just noise, envelope disabled
		// * Envelope controlling tone and/or noise
		// * Tone and noise disabled, envelope enabled with high frequency
		// * Tone and noise together
		// * Tone and noise together with envelope
		
		// This loop only runs one iteration if envelope is disabled. If envelope
		// is being used as a waveform (tone and noise disabled), this loop will
		// still be reasonably efficient since the bulk of it will be skipped.
		while ( 1 )
		{
			// current amplitude
			int amp = 0;
			if ( (osc_mode | osc->phase) & 1 & (osc_mode >> 3 | noise_lfsr) )
				amp = volume;
			{
				int delta = amp - osc->last_amp;
				if ( delta )
				{
					osc->last_amp = amp;
					synth_.offset( start_time, delta, osc_output );
				}
			}
			
			// Run wave and noise interleved with each catching up to the other.
			// If one or both are disabled, their "current time" will be past end time,
			// so there will be no significant performance hit.
			if ( ntime < end_time || time < end_time )
			{
				// Since amplitude was updated above, delta will always be +/- volume,
				// so we can avoid using last_amp every time to calculate the delta.
				int delta = amp * 2 - volume;
				int delta_non_zero = delta != 0;
				int phase = osc->phase | (osc_mode & tone_off); assert( tone_off == 0x01 );
				do
				{
					// run noise
					blip_time_t end = end_time;
					if ( end_time > time ) end = time;
					if ( phase & delta_non_zero )
					{
						while ( ntime <= end ) // must advance *past* time to avoid hang
						{
							int changed = noise_lfsr + 1;
							noise_lfsr = ((blargg_ulong)-(blargg_long)(noise_lfsr & 1) & 0x12000) ^ (noise_lfsr >> 1);
							if ( changed & 2 )
							{
								delta = -delta;
								synth_.offset( ntime, delta, osc_output );
							}
							ntime += noise_period;
						}
					}
					else
					{
						// 20 or more noise periods on average for some music
						blargg_long remain = end - ntime;
						blargg_long count = remain / noise_period;
						if ( remain >= 0 )
							ntime += noise_period + count * noise_period;
					}
					
					// run tone
					end = end_time;
					if ( end_time > ntime ) end = ntime;
					if ( noise_lfsr & delta_non_zero )
					{
						while ( time < end )
						{
							delta = -delta;
							synth_.offset( time, delta, osc_output );
							time += period;
							//phase ^= 1;
						}
						//assert( phase == (delta > 0) );
						phase = unsigned (-delta) >> (CHAR_BIT * sizeof (unsigned) - 1);
						// (delta > 0)
					}
					else
					{
						// loop usually runs less than once
						//SUB_CASE_COUNTER( (time < end) * (end - time + period - 1) / period );
						
						while ( time < end )
						{
							time += period;
							phase ^= 1;
						}
					}
				}
				while ( time < end_time || ntime < end_time );
				
				osc->last_amp = (delta + volume) >> 1;
				if ( !(osc_mode & tone_off) )
					osc->phase = phase;
			}
			
			if ( end_time >= final_end_time )
				break; // breaks first time when envelope is disabled
			
			// next envelope step
			if ( ++osc_env_pos >= 0 )
				osc_env_pos -= 32;
			volume = env.wave [osc_env_pos] >> half_vol;
			
			start_time = end_time;
			end_time += env_period;
			if ( end_time > final_end_time )
				end_time = final_end_time;
		}
		osc->delay = time - final_end_time;
		
		if ( !(osc_mode & noise_off) )
		{
			noise.delay = ntime - final_end_time;
			noise.lfsr = noise_lfsr;
		}
	}
	
	// TODO: optimized saw wave envelope?
	
	// maintain envelope phase
	blip_time_t remain = final_end_time - last_time - env.delay;
	if ( remain >= 0 )
	{
		blargg_long count = (remain + env_period) / env_period;
		env.pos += count;
		if ( env.pos >= 0 )
			env.pos = (env.pos & 31) - 32;
		remain -= count * env_period;
		assert( -remain <= env_period );
	}
	env.delay = -remain;
	assert( env.delay > 0 );
	assert( env.pos < 0 );
	
	last_time = final_end_time;
}